

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodePtr xmlXPathNextPrecedingInternal(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlNsPtr ns;
  xmlNodePtr cur_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0)) {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else {
    ns = (xmlNsPtr)cur;
    if (cur == (xmlNodePtr)0x0) {
      ns = (xmlNsPtr)ctxt->context->node;
      if ((xmlNodePtr)ns == (xmlNodePtr)0x0) {
        return (xmlNodePtr)0x0;
      }
      if (((xmlNodePtr)ns)->type == XML_ATTRIBUTE_NODE) {
        ns = (xmlNsPtr)((xmlNodePtr)ns)->parent;
      }
      else if (((xmlNodePtr)ns)->type == XML_NAMESPACE_DECL) {
        if ((((xmlNodePtr)ns)->_private == (void *)0x0) ||
           (*(int *)((long)((xmlNodePtr)ns)->_private + 8) == 0x12)) {
          return (xmlNodePtr)0x0;
        }
        ns = (xmlNsPtr)((xmlNodePtr)ns)->_private;
      }
      ctxt->ancestor = (xmlNodePtr)ns->context;
    }
    if (ns->type == XML_NAMESPACE_DECL) {
      ctxt_local = (xmlXPathParserContextPtr)0x0;
    }
    else {
      if ((*(long *)&ns[1].type != 0) && (*(int *)(*(long *)&ns[1].type + 8) == 0xe)) {
        ns = *(xmlNsPtr *)&ns[1].type;
      }
      while (*(long *)&ns[1].type == 0) {
        ns = (xmlNsPtr)ns->context;
        if ((_xmlDoc *)ns == (_xmlDoc *)0x0) {
          return (xmlNodePtr)0x0;
        }
        if ((_xmlDoc *)ns == (_xmlDoc *)ctxt->context->doc->children) {
          return (xmlNodePtr)0x0;
        }
        if ((_xmlDoc *)ns != (_xmlDoc *)ctxt->ancestor) {
          return (xmlNodePtr)(_xmlDoc *)ns;
        }
        ctxt->ancestor = ((_xmlDoc *)ns)->parent;
      }
      for (ns = *(xmlNsPtr *)&ns[1].type; ns->_private != (void *)0x0; ns = (xmlNsPtr)ns->_private)
      {
      }
      ctxt_local = (xmlXPathParserContextPtr)ns;
    }
  }
  return (xmlNodePtr)ctxt_local;
}

Assistant:

static xmlNodePtr
xmlXPathNextPrecedingInternal(xmlXPathParserContextPtr ctxt,
                              xmlNodePtr cur)
{
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if (cur == NULL) {
        cur = ctxt->context->node;
        if (cur == NULL)
            return (NULL);
        if (cur->type == XML_ATTRIBUTE_NODE) {
            cur = cur->parent;
        } else if (cur->type == XML_NAMESPACE_DECL) {
            xmlNsPtr ns = (xmlNsPtr) cur;

            if ((ns->next == NULL) ||
                (ns->next->type == XML_NAMESPACE_DECL))
                return (NULL);
            cur = (xmlNodePtr) ns->next;
        }
        ctxt->ancestor = cur->parent;
    }
    if (cur->type == XML_NAMESPACE_DECL)
        return(NULL);
    if ((cur->prev != NULL) && (cur->prev->type == XML_DTD_NODE))
	cur = cur->prev;
    while (cur->prev == NULL) {
        cur = cur->parent;
        if (cur == NULL)
            return (NULL);
        if (cur == ctxt->context->doc->children)
            return (NULL);
        if (cur != ctxt->ancestor)
            return (cur);
        ctxt->ancestor = cur->parent;
    }
    cur = cur->prev;
    while (cur->last != NULL)
        cur = cur->last;
    return (cur);
}